

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
betterThreshold<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *th,Real epsilon)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_2a8;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_228;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined5 uStack_1d0;
  undefined3 uStack_1cb;
  undefined5 uStack_1c8;
  undefined8 uStack_1c3;
  undefined8 local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined5 uStack_110;
  undefined3 uStack_10b;
  undefined5 uStack_108;
  undefined8 uStack_103;
  undefined8 local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined5 uStack_88;
  undefined8 uStack_83;
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)(this + 0x20);
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)this;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)(this + 8);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)(this + 0x10);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(this + 0x18);
  local_68.m_backend.exp = *(int *)(this + 0x28);
  local_68.m_backend.neg = *(bool *)(this + 0x2c);
  local_68.m_backend._48_8_ = *(undefined8 *)(this + 0x30);
  local_78 = 0xa00000000;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  uStack_8b = 0;
  uStack_88 = 0;
  uStack_83 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,0.1);
  bVar5 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&local_68,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_a8,1e-15);
  if (bVar5) {
    local_268.fpclass = cpp_dec_float_finite;
    local_268.prec_elem = 10;
    local_268.data._M_elems[0] = 0;
    local_268.data._M_elems[1] = 0;
    local_268.data._M_elems[2] = 0;
    local_268.data._M_elems[3] = 0;
    local_268.data._M_elems[4] = 0;
    local_268.data._M_elems[5] = 0;
    local_268.data._M_elems._24_5_ = 0;
    local_268.data._M_elems[7]._1_3_ = 0;
    local_268.data._M_elems._32_5_ = 0;
    local_268.data._M_elems[9]._1_3_ = 0;
    local_268.exp = 0;
    local_268.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_268,10.0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              ((cpp_dec_float<50U,_int,_void> *)this,&local_268);
  }
  else {
    local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(this + 0x20);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)this;
    local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(this + 8);
    local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(this + 0x10);
    local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(this + 0x18);
    local_e8.m_backend.exp = *(int *)(this + 0x28);
    local_e8.m_backend.neg = *(bool *)(this + 0x2c);
    local_e8.m_backend._48_8_ = *(undefined8 *)(this + 0x30);
    local_f8 = 0xa00000000;
    local_128 = 0;
    uStack_120 = 0;
    local_118 = 0;
    uStack_110 = 0;
    uStack_10b = 0;
    uStack_108 = 0;
    uStack_103 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_128,0.9);
    bVar5 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_e8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_128,epsilon);
    if (bVar5) {
      local_228.fpclass = cpp_dec_float_finite;
      local_228.prec_elem = 10;
      local_228.data._M_elems[0] = 0;
      local_228.data._M_elems[1] = 0;
      local_228.data._M_elems[2] = 0;
      local_228.data._M_elems[3] = 0;
      local_228.data._M_elems[4] = 0;
      local_228.data._M_elems[5] = 0;
      local_228.data._M_elems._24_5_ = 0;
      local_228.data._M_elems[7]._1_3_ = 0;
      local_228.data._M_elems._32_5_ = 0;
      local_228._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_228,1.0);
      local_2a8.fpclass = cpp_dec_float_finite;
      local_2a8.prec_elem = 10;
      local_2a8.data._M_elems[0] = 0;
      local_2a8.data._M_elems[1] = 0;
      local_2a8.data._M_elems[2] = 0;
      local_2a8.data._M_elems[3] = 0;
      local_2a8.data._M_elems[4] = 0;
      local_2a8.data._M_elems[5] = 0;
      local_2a8.data._M_elems._24_5_ = 0;
      local_2a8.data._M_elems[7]._1_3_ = 0;
      local_2a8.data._M_elems._32_5_ = 0;
      local_2a8.data._M_elems[9]._1_3_ = 0;
      local_2a8.exp = 0;
      local_2a8.neg = false;
      if (&local_2a8 != (cpp_dec_float<50U,_int,_void> *)this) {
        local_2a8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(this + 0x20),0);
        local_2a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)*(undefined8 *)(this + 0x20) >> 0x28)
        ;
        local_2a8.data._M_elems._0_8_ = *(undefined8 *)this;
        local_2a8.data._M_elems._8_8_ = *(undefined8 *)(this + 8);
        local_2a8.data._M_elems._16_8_ = *(undefined8 *)(this + 0x10);
        local_2a8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(this + 0x18),0);
        local_2a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)*(undefined8 *)(this + 0x18) >> 0x28)
        ;
        local_2a8.exp = *(int *)(this + 0x28);
        local_2a8.neg = *(bool *)(this + 0x2c);
        local_2a8._48_8_ = *(undefined8 *)(this + 0x30);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_2a8,&local_228);
      local_168.fpclass = cpp_dec_float_finite;
      local_168.prec_elem = 10;
      local_168.data._M_elems[0] = 0;
      local_168.data._M_elems[1] = 0;
      local_168.data._M_elems[2] = 0;
      local_168.data._M_elems[3] = 0;
      local_168.data._M_elems[4] = 0;
      local_168.data._M_elems[5] = 0;
      local_168.data._M_elems._24_5_ = 0;
      local_168.data._M_elems[7]._1_3_ = 0;
      local_168.data._M_elems._32_5_ = 0;
      local_168._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_168,2.0);
      local_268.fpclass = cpp_dec_float_finite;
      local_268.prec_elem = 10;
      local_268.data._M_elems[0] = 0;
      local_268.data._M_elems[1] = 0;
      local_268.data._M_elems[2] = 0;
      local_268.data._M_elems[3] = 0;
      local_268.data._M_elems[4] = 0;
      local_268.data._M_elems[5] = 0;
      local_268.data._M_elems._24_5_ = 0;
      local_268.data._M_elems[7]._1_3_ = 0;
      local_268.data._M_elems._32_5_ = 0;
      local_268.data._M_elems[9]._1_3_ = 0;
      local_268.exp = 0;
      local_268.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_268,&local_2a8,&local_168);
      *(ulong *)(this + 0x20) =
           CONCAT35(local_268.data._M_elems[9]._1_3_,local_268.data._M_elems._32_5_);
      *(undefined8 *)(this + 0x10) = local_268.data._M_elems._16_8_;
      *(ulong *)(this + 0x18) =
           CONCAT35(local_268.data._M_elems[7]._1_3_,local_268.data._M_elems._24_5_);
      *(undefined8 *)this = local_268.data._M_elems._0_8_;
      *(undefined8 *)(this + 8) = local_268.data._M_elems._8_8_;
      *(int *)(this + 0x28) = local_268.exp;
      this[0x2c] = (soplex)local_268.neg;
    }
    else {
      local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(this + 0x20);
      local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)this;
      local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(this + 8);
      local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(this + 0x10);
      local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(this + 0x18);
      local_1a8.m_backend.exp = *(int *)(this + 0x28);
      local_1a8.m_backend.neg = *(bool *)(this + 0x2c);
      local_1a8.m_backend._48_8_ = *(undefined8 *)(this + 0x30);
      local_1b8 = 0xa00000000;
      local_1e8 = 0;
      uStack_1e0 = 0;
      local_1d8 = 0;
      uStack_1d0 = 0;
      uStack_1cb = 0;
      uStack_1c8 = 0;
      uStack_1c3 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1e8,0.999);
      bVar5 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_1a8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1e8,epsilon);
      if (!bVar5) goto LAB_0017b450;
      local_268.fpclass = cpp_dec_float_finite;
      local_268.prec_elem = 10;
      local_268.data._M_elems[0] = 0;
      local_268.data._M_elems[1] = 0;
      local_268.data._M_elems[2] = 0;
      local_268.data._M_elems[3] = 0;
      local_268.data._M_elems[4] = 0;
      local_268.data._M_elems[5] = 0;
      local_268.data._M_elems._24_5_ = 0;
      local_268.data._M_elems[7]._1_3_ = 0;
      local_268.data._M_elems._32_5_ = 0;
      local_268.data._M_elems[9]._1_3_ = 0;
      local_268.exp = 0;
      local_268.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_268,0.99999);
      *(undefined8 *)this = local_268.data._M_elems._0_8_;
      *(undefined8 *)(this + 8) = local_268.data._M_elems._8_8_;
      *(undefined8 *)(this + 0x10) = local_268.data._M_elems._16_8_;
      *(ulong *)(this + 0x18) =
           CONCAT35(local_268.data._M_elems[7]._1_3_,local_268.data._M_elems._24_5_);
      *(ulong *)(this + 0x20) =
           CONCAT35(local_268.data._M_elems[9]._1_3_,local_268.data._M_elems._32_5_);
      *(int *)(this + 0x28) = local_268.exp;
      this[0x2c] = (soplex)local_268.neg;
    }
    *(undefined8 *)(this + 0x30) = local_268._48_8_;
  }
LAB_0017b450:
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
       *(undefined8 *)(this + 0x20);
  uVar2 = *(undefined8 *)this;
  uVar3 = *(undefined8 *)(this + 8);
  uVar4 = *(undefined8 *)(this + 0x18);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
       *(undefined8 *)(this + 0x10);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar4;
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar2;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar3;
  (__return_storage_ptr__->m_backend).exp = *(int *)(this + 0x28);
  (__return_storage_ptr__->m_backend).neg = (bool)this[0x2c];
  pnVar1 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             **)(this + 0x30);
  *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    **)&(__return_storage_ptr__->m_backend).fpclass = pnVar1;
  return pnVar1;
}

Assistant:

static R betterThreshold(R th, Real epsilon)
{
   assert(th < R(1.0));

   if(LT(th, R(0.1), 1e-15))
      th *= R(10.0);
   else if(LT(th, R(0.9), epsilon))
      th = (th + R(1.0)) / R(2.0);
   else if(LT(th, R(0.999), epsilon))
      th = R(0.99999);

   assert(th < R(1.0));

   return th;
}